

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

void __thiscall
duckdb::ClientContext::CheckIfPreparedStatementIsExecutable
          (ClientContext *this,PreparedStatementData *statement)

{
  _Hash_node_base *p_Var1;
  MetaTransaction *pMVar2;
  ValidChecker *pVVar3;
  type this_00;
  DatabaseManager *this_01;
  InternalException *this_02;
  InvalidInputException *this_03;
  TransactionException *__return_storage_ptr__;
  StatementType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  optional_ptr<duckdb::AttachedDatabase,_true> entry;
  optional_ptr<duckdb::AttachedDatabase,_true> local_d8;
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pMVar2 = TransactionContext::ActiveTransaction(&this->transaction);
  pVVar3 = ValidChecker::Get(pMVar2);
  if ((((pVVar3->is_invalidated)._M_base._M_i & 1U) != 0) &&
     ((statement->properties).requires_valid_transaction == true)) {
    __return_storage_ptr__ = (TransactionException *)__cxa_allocate_exception(0x10);
    ErrorManager::InvalidatedTransaction(__return_storage_ptr__,this);
    __cxa_throw(__return_storage_ptr__,&TransactionException::typeinfo,
                ::std::runtime_error::~runtime_error);
  }
  pMVar2 = MetaTransaction::Get(this);
  this_00 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(&this->db);
  this_01 = DatabaseInstance::GetDatabaseManager(this_00);
  p_Var1 = (statement->properties).modified_databases._M_h._M_before_begin._M_nxt;
  while( true ) {
    if (p_Var1 == (_Hash_node_base *)0x0) {
      return;
    }
    local_d8 = DatabaseManager::GetDatabase(this_01,this,(string *)(p_Var1 + 1));
    if (local_d8.ptr == (AttachedDatabase *)0x0) break;
    optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_d8);
    if ((local_d8.ptr)->type == READ_ONLY_DATABASE) {
      this_03 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      local_b0[0] = local_a0;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b0,
                 "Cannot execute statement of type \"%s\" on database \"%s\" which is attached in read-only mode!"
                 ,"");
      StatementTypeToString_abi_cxx11_(&local_50,(duckdb *)(ulong)statement->statement_type,type);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,p_Var1[1]._M_nxt,
                 (long)&(p_Var1[1]._M_nxt)->_M_nxt + (long)&(p_Var1[2]._M_nxt)->_M_nxt);
      StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                (&local_d0,(StringUtil *)local_b0,&local_50,&local_90,in_R8);
      InvalidInputException::InvalidInputException(this_03,(string *)&local_d0);
      __cxa_throw(this_03,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::AttachedDatabase,_true>::CheckValid(&local_d8);
    MetaTransaction::ModifyDatabase(pMVar2,local_d8.ptr);
    p_Var1 = p_Var1->_M_nxt;
  }
  this_02 = (InternalException *)__cxa_allocate_exception(0x10);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,"Database \"%s\" not found","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,p_Var1[1]._M_nxt,
             (long)&(p_Var1[1]._M_nxt)->_M_nxt + (long)&(p_Var1[2]._M_nxt)->_M_nxt);
  InternalException::InternalException<std::__cxx11::string>(this_02,&local_d0,&local_70);
  __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ClientContext::CheckIfPreparedStatementIsExecutable(PreparedStatementData &statement) {
	if (ValidChecker::IsInvalidated(ActiveTransaction()) && statement.properties.requires_valid_transaction) {
		throw ErrorManager::InvalidatedTransaction(*this);
	}
	auto &meta_transaction = MetaTransaction::Get(*this);
	auto &manager = DatabaseManager::Get(*this);
	for (auto &it : statement.properties.modified_databases) {
		auto &modified_database = it.first;
		auto entry = manager.GetDatabase(*this, modified_database);
		if (!entry) {
			throw InternalException("Database \"%s\" not found", modified_database);
		}
		if (entry->IsReadOnly()) {
			throw InvalidInputException(StringUtil::Format(
			    "Cannot execute statement of type \"%s\" on database \"%s\" which is attached in read-only mode!",
			    StatementTypeToString(statement.statement_type), modified_database));
		}
		meta_transaction.ModifyDatabase(*entry);
	}
}